

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O0

void smix1(uint8_t *B,size_t r,uint32_t N,yescrypt_flags_t flags,salsa20_blk_t *V,uint32_t NROM,
          salsa20_blk_t *VROM,salsa20_blk_t *XY,pwxform_ctx_t *ctx)

{
  uint32_t uVar1;
  uint in_ECX;
  uint in_EDX;
  size_t in_RSI;
  long in_RDI;
  long in_R8;
  long in_stack_00000008;
  long in_stack_00000010;
  uint32_t m_1;
  salsa20_blk_t *V_j_1;
  salsa20_blk_t *V_n_1;
  uint32_t n_1;
  uint32_t m;
  salsa20_blk_t *V_j;
  salsa20_blk_t *V_n;
  uint32_t n;
  size_t k;
  uint32_t j;
  uint32_t i;
  salsa20_blk_t *Y;
  salsa20_blk_t *X;
  size_t s;
  pwxform_ctx_t *in_stack_000000d0;
  size_t in_stack_000000d8;
  salsa20_blk_t *in_stack_000000e0;
  salsa20_blk_t *in_stack_000000e8;
  pwxform_ctx_t *in_stack_00000180;
  int in_stack_0000018c;
  size_t in_stack_00000190;
  salsa20_blk_t *in_stack_00000198;
  salsa20_blk_t *in_stack_000001a0;
  salsa20_blk_t *in_stack_000001a8;
  size_t in_stack_000003a8;
  salsa20_blk_t *in_stack_000003b0;
  salsa20_blk_t *in_stack_000003b8;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_70;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_44;
  
  for (local_50 = 0; local_50 < in_RSI << 1; local_50 = local_50 + 1) {
    for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
      uVar1 = le32dec((void *)(in_RDI + (local_50 * 0x10 + (ulong)(local_44 * 5 & 0xf)) * 4));
      *(uint32_t *)(in_R8 + local_50 * 0x40 + (ulong)local_44 * 4) = uVar1;
    }
  }
  if (in_stack_00000008 == 0) {
    if ((in_ECX & 1) == 0) {
      for (local_44 = 1; local_44 < in_EDX - 1; local_44 = local_44 + 2) {
        blockmix_salsa8(in_stack_000003b8,in_stack_000003b0,in_stack_000003a8);
        blockmix_salsa8(in_stack_000003b8,in_stack_000003b0,in_stack_000003a8);
      }
      blockmix_salsa8(in_stack_000003b8,in_stack_000003b0,in_stack_000003a8);
      blockmix_salsa8(in_stack_000003b8,in_stack_000003b0,in_stack_000003a8);
    }
    else {
      blockmix(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
      blockmix(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
      integerify((salsa20_blk_t *)(in_R8 + in_RSI * 0x100),in_RSI);
      for (local_70 = 2; local_70 < in_EDX; local_70 = local_70 << 1) {
        if (local_70 < in_EDX >> 1) {
          local_8c = local_70;
        }
        else {
          local_8c = (in_EDX - 1) - local_70;
        }
        for (local_44 = 1; local_44 < local_8c; local_44 = local_44 + 2) {
          blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                       in_stack_0000018c,in_stack_00000180);
          blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                       in_stack_0000018c,in_stack_00000180);
        }
      }
      blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                   in_stack_0000018c,in_stack_00000180);
      blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                   in_stack_0000018c,in_stack_00000180);
    }
  }
  else {
    blockmix(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
    integerify((salsa20_blk_t *)(in_R8 + in_RSI * 0x80),in_RSI);
    blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                 in_stack_0000018c,in_stack_00000180);
    for (local_54 = 2; local_54 < in_EDX; local_54 = local_54 << 1) {
      if (local_54 < in_EDX >> 1) {
        local_88 = local_54;
      }
      else {
        local_88 = (in_EDX - 1) - local_54;
      }
      for (local_44 = 1; local_44 < local_88; local_44 = local_44 + 2) {
        blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                     in_stack_0000018c,in_stack_00000180);
        blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                     in_stack_0000018c,in_stack_00000180);
      }
    }
    blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                 in_stack_0000018c,in_stack_00000180);
    blockmix_xor(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
                 in_stack_0000018c,in_stack_00000180);
  }
  for (local_50 = 0; local_50 < in_RSI << 1; local_50 = local_50 + 1) {
    for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
      le32enc((void *)(in_RDI + (local_50 * 0x10 + (ulong)(local_44 * 5 & 0xf)) * 4),
              *(uint32_t *)(in_stack_00000010 + local_50 * 0x40 + (ulong)local_44 * 4));
    }
  }
  return;
}

Assistant:

static void
smix1(uint8_t * B, size_t r, uint32_t N, yescrypt_flags_t flags,
    salsa20_blk_t * V, uint32_t NROM, const salsa20_blk_t * VROM,
    salsa20_blk_t * XY, pwxform_ctx_t * ctx)
{
	size_t s = 2 * r;
	salsa20_blk_t * X = V, * Y;
	uint32_t i, j;
	size_t k;

	/* 1: X <-- B */
	/* 3: V_i <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			X[k].w[i] = le32dec(&B[(k * 16 + (i * 5 % 16)) * 4]);
		}
	}

	if (VROM) {
		uint32_t n;
		salsa20_blk_t * V_n;
		const salsa20_blk_t * V_j;

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[s];
		blockmix(X, Y, r, ctx);

		X = &V[2 * s];
		/* j <-- Integerify(X) mod NROM */
		j = integerify(Y, r) & (NROM - 1);
		V_j = &VROM[j * s];

		/* X <-- H(X \xor VROM_j) */
		j = blockmix_xor(Y, V_j, X, r, 1, ctx);

		for (n = 2; n < N; n <<= 1) {
			uint32_t m = (n < N / 2) ? n : (N - 1 - n);

			V_n = &V[n * s];

			/* 2: for i = 0 to N - 1 do */
			for (i = 1; i < m; i += 2) {
				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i - 1;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				Y = &V_n[i * s];

				/* j <-- Integerify(X) mod NROM */
				j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
				V_j = &VROM[j * s];

				/* X <-- H(X \xor VROM_j) */
				X = &V_n[(i + 1) * s];
				j = blockmix_xor(Y, V_j, X, r, 1, ctx);
			}
		}

		n >>= 1;

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 2 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[(N - 1) * s];

		/* j <-- Integerify(X) mod NROM */
		j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
		V_j = &VROM[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		X = XY;
		blockmix_xor(Y, V_j, X, r, 1, ctx);
	} else if (flags & YESCRYPT_RW) {
		uint32_t n;
		salsa20_blk_t * V_n, * V_j;

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[s];
		blockmix(X, Y, r, ctx);

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		X = &V[2 * s];
		blockmix(Y, X, r, ctx);
		j = integerify(X, r);

		for (n = 2; n < N; n <<= 1) {
			uint32_t m = (n < N / 2) ? n : (N - 1 - n);

			V_n = &V[n * s];

			/* 2: for i = 0 to N - 1 do */
			for (i = 1; i < m; i += 2) {
				Y = &V_n[i * s];

				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i - 1;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				j = blockmix_xor(X, V_j, Y, r, 0, ctx);

				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				X = &V_n[(i + 1) * s];
				j = blockmix_xor(Y, V_j, X, r, 0, ctx);
			}
		}

		n >>= 1;

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 2 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[(N - 1) * s];
		j = blockmix_xor(X, V_j, Y, r, 0, ctx);

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 1 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		X = XY;
		blockmix_xor(Y, V_j, X, r, 0, ctx);
	} else {
		/* 2: for i = 0 to N - 1 do */
		for (i = 1; i < N - 1; i += 2) {
			/* 4: X <-- H(X) */
			/* 3: V_i <-- X */
			Y = &V[i * s];
			blockmix_salsa8(X, Y, r);

			/* 4: X <-- H(X) */
			/* 3: V_i <-- X */
			X = &V[(i + 1) * s];
			blockmix_salsa8(Y, X, r);
		}

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[i * s];
		blockmix_salsa8(X, Y, r);

		/* 4: X <-- H(X) */
		X = XY;
		blockmix_salsa8(Y, X, r);
	}

	/* B' <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			le32enc(&B[(k * 16 + (i * 5 % 16)) * 4], X[k].w[i]);
		}
	}
}